

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O2

int is_global_mv_block(MB_MODE_INFO *mbmi,TransformationType type)

{
  byte bVar1;
  
  bVar1 = block_size_high[mbmi->bsize];
  if (block_size_wide[mbmi->bsize] < block_size_high[mbmi->bsize]) {
    bVar1 = block_size_wide[mbmi->bsize];
  }
  return (int)((1 < type && (mbmi->mode - 0xf & 0xf7) == 0) && 7 < bVar1);
}

Assistant:

static inline int is_global_mv_block(const MB_MODE_INFO *const mbmi,
                                     TransformationType type) {
  const PREDICTION_MODE mode = mbmi->mode;
  const BLOCK_SIZE bsize = mbmi->bsize;
  const int block_size_allowed =
      AOMMIN(block_size_wide[bsize], block_size_high[bsize]) >= 8;
  return (mode == GLOBALMV || mode == GLOBAL_GLOBALMV) && type > TRANSLATION &&
         block_size_allowed;
}